

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnBrTableExpr
          (BinaryReaderInterp *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  Index index;
  Index index_00;
  bool bVar1;
  Result RVar2;
  Location local_120;
  Var local_100;
  Enum local_b8;
  Enum local_b4;
  Location local_b0;
  Var local_90;
  Enum local_44;
  Index local_40;
  uint local_3c;
  Index depth;
  Index i;
  Index keep_count;
  Index drop_count;
  Index *pIStack_28;
  Index default_target_depth_local;
  Index *target_depths_local;
  BinaryReaderInterp *pBStack_18;
  Index num_targets_local;
  BinaryReaderInterp *this_local;
  
  drop_count = default_target_depth;
  pIStack_28 = target_depths;
  target_depths_local._4_4_ = num_targets;
  pBStack_18 = this;
  keep_count = (Index)SharedValidator::BeginBrTable
                                (&this->validator_,
                                 (Location *)(anonymous_namespace)::BinaryReaderInterp::loc);
  bVar1 = Failed((Result)keep_count);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,BrTable,target_depths_local._4_4_);
    for (local_3c = 0; index_00 = drop_count, local_3c < target_depths_local._4_4_;
        local_3c = local_3c + 1) {
      index = pIStack_28[local_3c];
      local_40 = index;
      Location::Location(&local_b0);
      Var::Var(&local_90,index,&local_b0);
      local_44 = (Enum)SharedValidator::OnBrTableTarget
                                 (&this->validator_,
                                  (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                                  &local_90);
      bVar1 = Failed((Result)local_44);
      Var::~Var(&local_90);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      local_b4 = (Enum)GetBrDropKeepCount(this,local_40,&i,&depth);
      bVar1 = Failed((Result)local_b4);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      Istream::Emit(this->istream_,InterpDropKeep,i,depth);
      EmitBr(this,local_40,0,0);
    }
    Location::Location(&local_120);
    Var::Var(&local_100,index_00,&local_120);
    local_b8 = (Enum)SharedValidator::OnBrTableTarget
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                                &local_100);
    bVar1 = Failed((Result)local_b8);
    Var::~Var(&local_100);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2 = GetBrDropKeepCount(this,drop_count,&i,&depth);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Istream::EmitDropKeep(this->istream_,i,depth);
        EmitBr(this,drop_count,0,0);
        RVar2 = SharedValidator::EndBrTable
                          (&this->validator_,
                           (Location *)(anonymous_namespace)::BinaryReaderInterp::loc);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnBrTableExpr(Index num_targets,
                                         Index* target_depths,
                                         Index default_target_depth) {
  CHECK_RESULT(validator_.BeginBrTable(loc));
  Index drop_count, keep_count;
  istream_.Emit(Opcode::BrTable, num_targets);

  for (Index i = 0; i < num_targets; ++i) {
    Index depth = target_depths[i];
    CHECK_RESULT(validator_.OnBrTableTarget(loc, Var(depth)));
    CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
    // Emit DropKeep directly (instead of using EmitDropKeep) so the
    // instruction has a fixed size.
    istream_.Emit(Opcode::InterpDropKeep, drop_count, keep_count);
    EmitBr(depth, 0, 0);
  }
  CHECK_RESULT(validator_.OnBrTableTarget(loc, Var(default_target_depth)));
  CHECK_RESULT(
      GetBrDropKeepCount(default_target_depth, &drop_count, &keep_count));
  // The default case doesn't need a fixed size, since it is never jumped over.
  istream_.EmitDropKeep(drop_count, keep_count);
  EmitBr(default_target_depth, 0, 0);

  CHECK_RESULT(validator_.EndBrTable(loc));
  return Result::Ok;
}